

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O2

void __thiscall
QHttp2ProtocolHandler::handleDataReceived
          (QHttp2ProtocolHandler *this,QByteArray *data,bool endStream)

{
  ContextType *object;
  QHttpNetworkReplyPrivate *this_00;
  bool bVar1;
  QObject *object_00;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar2;
  QHttpNetworkRequestPrivate *pQVar3;
  long in_FS_OFFSET;
  code *local_50;
  undefined8 local_48;
  QHttp2Stream *stream;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  object_00 = (QObject *)QObject::sender();
  stream = QtPrivate::qobject_cast_helper<QHttp2Stream*,QObject>(object_00);
  ppVar2 = QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::operator[]
                     ((QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *
                      )(this + 0x50),&stream);
  if ((data->d).size != 0) {
    object = ppVar2->second;
    pQVar3 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(&(ppVar2->first).d);
    if (pQVar3->needResendWithCredentials == false) {
      this_00 = *(QHttpNetworkReplyPrivate **)&object->field_0x8;
      this_00->totalProgress = this_00->totalProgress + (data->d).size;
      QByteDataBuffer::append(&this_00->responseData,data);
      bVar1 = QHttpNetworkReplyPrivate::shouldEmitSignals(this_00);
      if (bVar1) {
        local_50 = QHttpNetworkReply::readyRead;
        local_48 = 0;
        QMetaObject::invokeMethod<void(QHttpNetworkReply::*)()>
                  (object,(offset_in_QHttpNetworkReply_to_subr *)&local_50,QueuedConnection);
        local_50 = QHttpNetworkReply::dataReadProgress;
        local_48 = 0;
        QMetaObject::
        invokeMethod<void(QHttpNetworkReply::*)(long_long,long_long),long_long&,long_long&>
                  (object,(offset_in_QHttpNetworkReply_to_subr *)&local_50,QueuedConnection,
                   &this_00->totalProgress,&this_00->bodyLength);
      }
    }
  }
  QByteDataBuffer::clear(&stream->m_downloadBuffer);
  if (endStream) {
    finishStream(this,stream,QueuedConnection);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::handleDataReceived(const QByteArray &data, bool endStream)
{
    QHttp2Stream *stream = qobject_cast<QHttp2Stream *>(sender());
    auto &httpPair = requestReplyPairs[stream];
    auto *httpReply = httpPair.second;
    Q_ASSERT(!stream->isPromisedStream());

    if (!data.isEmpty() && !httpPair.first.d->needResendWithCredentials) {
        auto *replyPrivate = httpReply->d_func();

        replyPrivate->totalProgress += data.size();

        replyPrivate->responseData.append(data);

        if (replyPrivate->shouldEmitSignals()) {
            QMetaObject::invokeMethod(httpReply, &QHttpNetworkReply::readyRead,
                                      Qt::QueuedConnection);
            QMetaObject::invokeMethod(httpReply, &QHttpNetworkReply::dataReadProgress,
                                      Qt::QueuedConnection, replyPrivate->totalProgress,
                                      replyPrivate->bodyLength);
        }
    }
    stream->clearDownloadBuffer();
    if (endStream)
        finishStream(stream, Qt::QueuedConnection);
}